

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  once_flag *__once;
  long lVar1;
  bool bVar2;
  FieldDescriptor FVar3;
  int iVar4;
  FieldGeneratorBase *pFVar5;
  Descriptor *pDVar6;
  WrapperFieldGenerator *this;
  PrimitiveFieldGenerator *this_00;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),&local_28,&local_30);
  }
  FVar3 = descriptor[2];
  if ((byte)FVar3 - 10 < 2) {
    __once = *(once_flag **)(descriptor + 0x18);
    if ((~(byte)descriptor[1] & 0x60) == 0) {
      if (__once != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_30 = descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_28,&local_30);
        FVar3 = descriptor[2];
      }
      if ((FVar3 == (FieldDescriptor)0xb) &&
         (bVar2 = FieldDescriptor::is_map_message_type(descriptor), bVar2)) {
        pFVar5 = (FieldGeneratorBase *)operator_new(0x50);
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
        return pFVar5;
      }
      this_00 = (PrimitiveFieldGenerator *)operator_new(0x50);
      RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                ((RepeatedMessageFieldGenerator *)this_00,descriptor,presenceIndex,options);
    }
    else {
      if (__once != (once_flag *)0x0) {
        local_28 = FieldDescriptor::TypeOnceInit;
        local_30 = descriptor;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (__once,&local_28,&local_30);
        FVar3 = descriptor[2];
      }
      if (FVar3 == (FieldDescriptor)0xb) {
        pDVar6 = FieldDescriptor::message_type(descriptor);
        iVar4 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar6 + 0x10));
        FVar3 = descriptor[1];
        if (iVar4 == 0) {
          lVar1 = *(long *)(descriptor + 0x28);
          if ((lVar1 != 0 && ((byte)FVar3 & 0x10) != 0) &&
             ((*(int *)(lVar1 + 4) != 1 || ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) == 0)))) {
            pFVar5 = (FieldGeneratorBase *)operator_new(0x58);
            WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                      ((WrapperOneofFieldGenerator *)pFVar5,descriptor,presenceIndex,options);
            return pFVar5;
          }
          this = (WrapperFieldGenerator *)operator_new(0x58);
          WrapperFieldGenerator::WrapperFieldGenerator(this,descriptor,presenceIndex,options);
          return &this->super_FieldGeneratorBase;
        }
      }
      else {
        FVar3 = descriptor[1];
      }
      lVar1 = *(long *)(descriptor + 0x28);
      if ((lVar1 == 0 || ((byte)FVar3 & 0x10) == 0) ||
         ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
        this_00 = (PrimitiveFieldGenerator *)operator_new(0x50);
        MessageFieldGenerator::MessageFieldGenerator
                  ((MessageFieldGenerator *)this_00,descriptor,presenceIndex,options);
      }
      else {
        this_00 = (PrimitiveFieldGenerator *)operator_new(0x50);
        MessageOneofFieldGenerator::MessageOneofFieldGenerator
                  ((MessageOneofFieldGenerator *)this_00,descriptor,presenceIndex,options);
      }
    }
  }
  else if (FVar3 == (FieldDescriptor)0xe) {
    if ((~(byte)descriptor[1] & 0x60) == 0) {
      this_00 = (PrimitiveFieldGenerator *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this_00,descriptor,presenceIndex,options);
    }
    else {
      lVar1 = *(long *)(descriptor + 0x28);
      if ((lVar1 == 0 || ((byte)descriptor[1] & 0x10) == 0) ||
         ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
        this_00 = (PrimitiveFieldGenerator *)operator_new(0x58);
        EnumFieldGenerator::EnumFieldGenerator
                  ((EnumFieldGenerator *)this_00,descriptor,presenceIndex,options);
      }
      else {
        this_00 = (PrimitiveFieldGenerator *)operator_new(0x58);
        EnumOneofFieldGenerator::EnumOneofFieldGenerator
                  ((EnumOneofFieldGenerator *)this_00,descriptor,presenceIndex,options);
      }
    }
  }
  else if ((~(byte)descriptor[1] & 0x60) == 0) {
    this_00 = (PrimitiveFieldGenerator *)operator_new(0x50);
    RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
              ((RepeatedPrimitiveFieldGenerator *)this_00,descriptor,presenceIndex,options);
  }
  else {
    lVar1 = *(long *)(descriptor + 0x28);
    if ((lVar1 == 0 || ((byte)descriptor[1] & 0x10) == 0) ||
       ((*(int *)(lVar1 + 4) == 1 && ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0)))) {
      this_00 = (PrimitiveFieldGenerator *)operator_new(0x58);
      PrimitiveFieldGenerator::PrimitiveFieldGenerator(this_00,descriptor,presenceIndex,options);
    }
    else {
      this_00 = (PrimitiveFieldGenerator *)operator_new(0x58);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)this_00,descriptor,presenceIndex,options);
    }
  }
  return &this_00->super_FieldGeneratorBase;
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex, options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex, options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex, options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex, options);
        }
      }
  }
}